

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>>::
emplace<QModelIndex,unsigned_int_const&>
          (QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>> *this,qsizetype i,
          QModelIndex *args,uint *args_1)

{
  long lVar1;
  undefined8 uVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  Inserter local_70;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar3 = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this)
      ;
      if (qVar3 == 0) goto LAB_00407982;
      std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
                ((pair<QPersistentModelIndex,_unsigned_int> *)
                 (*(long *)(this + 0x10) * 0x10 + *(long *)(this + 8)),args,args_1);
LAB_00407a87:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_00407a41;
    }
LAB_00407982:
    if (i == 0) {
      qVar3 = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this)
      ;
      if (qVar3 != 0) {
        std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
                  ((pair<QPersistentModelIndex,_unsigned_int> *)(*(long *)(this + 8) + -0x10),args,
                   args_1);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
        goto LAB_00407a87;
      }
    }
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
            ((pair<QPersistentModelIndex,_unsigned_int> *)local_48,args,args_1);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
             (uint)(i == 0 && lVar1 != 0),1,(pair<QPersistentModelIndex,_unsigned_int> **)0x0,
             (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0);
  uVar2 = local_48._0_8_;
  if (i == 0 && lVar1 != 0) {
    lVar1 = *(long *)(this + 8);
    local_48._0_8_ = (QPersistentModelIndexData *)0x0;
    *(undefined8 *)(lVar1 + -0x10) = uVar2;
    *(undefined4 *)(lVar1 + -8) = local_48._8_4_;
    *(long *)(this + 8) = lVar1 + -0x10;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::Inserter
              (&local_70,(QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
               i,1);
    uVar2 = local_48._0_8_;
    local_48._0_8_ = (QPersistentModelIndexData *)0x0;
    ((local_70.displaceFrom)->first).d = (QPersistentModelIndexData *)uVar2;
    (local_70.displaceFrom)->second = local_48._8_4_;
    local_70.displaceFrom = local_70.displaceFrom + 1;
    QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::~Inserter
              (&local_70);
  }
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)local_48);
LAB_00407a41:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }